

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

int set_strap_from_file(char *path)

{
  size_t sVar1;
  size_t size;
  char tmp [22];
  FILE *strapfile;
  char *path_local;
  
  stack0xffffffffffffffe0 = (FILE *)0x0;
  register0x00000000 = fopen(path,"r");
  if (register0x00000000 == (FILE *)0x0) {
    path_local._4_4_ = 1;
  }
  else {
    sVar1 = fread(&size,1,0x15,register0x00000000);
    tmp[sVar1 - 8] = '\0';
    path_local._4_4_ = set_strap_from_string((char *)&size);
  }
  return path_local._4_4_;
}

Assistant:

int set_strap_from_file(const char *path)
{
	FILE *strapfile = NULL;
	char tmp[22];

	strapfile = fopen(path, "r");
	if (strapfile) {
		size_t size = fread(tmp, 1, 21, strapfile);
		tmp[size] = 0;
		return set_strap_from_string(tmp);
	}

	return 1;
}